

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# initest.c
# Opt level: O2

void pacf_yw(double *vec,int N,double *par,int M)

{
  double *phi;
  ulong uVar1;
  ulong uVar2;
  
  phi = (double *)malloc((long)M * 8);
  uVar2 = 0;
  uVar1 = (ulong)(uint)M;
  if (M < 1) {
    uVar1 = uVar2;
  }
  while (uVar1 != uVar2) {
    ywalg(vec,N,(int)(uVar2 + 1),phi);
    par[uVar2] = phi[uVar2];
    uVar2 = uVar2 + 1;
  }
  free(phi);
  return;
}

Assistant:

void pacf_yw(double* vec, int N, double* par, int M) {
	int i;
	double *temp;

	temp = (double*)malloc(sizeof(double)* M);
	for (i = 0; i < M; ++i) {
		ywalg(vec, N, i + 1, temp);
		par[i] = temp[i];
	}
	free(temp);
}